

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_device.cpp
# Opt level: O0

void __thiscall
booster::aio::basic_io_device::set_non_blocking
          (basic_io_device *this,bool nonblocking,error_code *e)

{
  int iVar1;
  undefined8 *in_RDX;
  byte in_SIL;
  long in_RDI;
  error_code eVar2;
  int flags;
  undefined4 uStack_3c;
  undefined4 uStack_2c;
  uint local_1c;
  
  local_1c = fcntl(*(int *)(in_RDI + 0x10),3,0);
  if ((int)local_1c < 0) {
    eVar2 = socket_details::geterror();
    *in_RDX = CONCAT44(uStack_2c,eVar2._M_value);
    in_RDX[1] = eVar2._M_cat;
  }
  else {
    if ((in_SIL & 1) == 0) {
      local_1c = local_1c & 0xfffff7ff;
    }
    else {
      local_1c = local_1c | 0x800;
    }
    iVar1 = fcntl(*(int *)(in_RDI + 0x10),4,(ulong)local_1c);
    if (iVar1 < 0) {
      eVar2 = socket_details::geterror();
      *in_RDX = CONCAT44(uStack_3c,eVar2._M_value);
      in_RDX[1] = eVar2._M_cat;
    }
    *(byte *)(in_RDI + 0x15) = in_SIL & 1;
  }
  return;
}

Assistant:

void basic_io_device::set_non_blocking(bool nonblocking,system::error_code &e)
{
	#if defined BOOSTER_WIN32
	unsigned long opt =  nonblocking;
	if(::ioctlsocket(fd_,FIONBIO,&opt) < 0)
		e=geterror();
	#elif ! defined(O_NONBLOCK)
	int opt = nonblocking;
	if(::ioctl(fd_,FIONBIO,&opt) < 0)
		e=geterror();
	#else 
	int flags = ::fcntl(fd_,F_GETFL,0);
	if(flags < 0) {
		e=geterror();
		return;
	}
	if(nonblocking)
		flags = flags | O_NONBLOCK;
	else
		flags = flags & ~O_NONBLOCK;

	if(::fcntl(fd_,F_SETFL,flags) < 0)
		e=geterror();
	#endif
	nonblocking_was_set_=nonblocking;
}